

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_push_image(nk_draw_list *list,nk_handle texture)

{
  nk_draw_command *pnVar1;
  nk_rect clip;
  nk_draw_command *prev;
  nk_draw_list *list_local;
  nk_handle texture_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x24b9,"void nk_draw_list_push_image(struct nk_draw_list *, nk_handle)");
  }
  if (list != (nk_draw_list *)0x0) {
    if (list->cmd_count == 0) {
      clip.w = 16384.0;
      clip.h = 16384.0;
      clip.x = -8192.0;
      clip.y = -8192.0;
      nk_draw_list_push_command(list,clip,texture);
    }
    else {
      pnVar1 = nk_draw_list_command_last(list);
      if (pnVar1->elem_count == 0) {
        pnVar1->texture = texture;
      }
      else {
        list_local._0_4_ = texture.id;
        if ((pnVar1->texture).id != (int)list_local) {
          nk_draw_list_push_command(list,pnVar1->clip_rect,texture);
        }
      }
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_draw_list_push_image(struct nk_draw_list *list, nk_handle texture)
{
    NK_ASSERT(list);
    if (!list) return;
    if (!list->cmd_count) {
        nk_draw_list_push_command(list, nk_null_rect, texture);
    } else {
        struct nk_draw_command *prev = nk_draw_list_command_last(list);
        if (prev->elem_count == 0) {
            prev->texture = texture;
        #ifdef NK_INCLUDE_COMMAND_USERDATA
            prev->userdata = list->userdata;
        #endif
    } else if (prev->texture.id != texture.id
        #ifdef NK_INCLUDE_COMMAND_USERDATA
            || prev->userdata.id != list->userdata.id
        #endif
        ) nk_draw_list_push_command(list, prev->clip_rect, texture);
    }
}